

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimples.cpp
# Opt level: O2

double pce(Mat *input)

{
  _InputArray *p_Var1;
  uint uVar2;
  ulong uVar3;
  int i;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double maxValue;
  undefined8 local_1d8;
  Point minLoc;
  Point maxLoc;
  double minValue;
  uint local_1b8;
  uint local_1b4;
  Mat res_pce;
  long local_1a0;
  long *local_168;
  Mat roi;
  Mat T;
  Mat T_;
  undefined8 *local_80;
  
  cv::Mat::Mat(&T_,8,8,6);
  *local_80 = 0x3ff0000000000000;
  cv::Mat::Mat(&T,8,8,_T_ & 0xfff);
  zero_mean(&T_,&T);
  uVar2 = *(int *)(input + 8) - 8;
  uVar4 = *(int *)(input + 0xc) - 8;
  local_1b8 = uVar2;
  local_1b4 = uVar4;
  cv::Mat::Mat(&res_pce,&local_1b8,6);
  uVar7 = 0;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar7;
  }
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar7;
  }
  for (; uVar7 != uVar5; uVar7 = uVar7 + 1) {
    for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      maxValue._0_4_ = (undefined4)uVar7;
      maxValue._4_4_ = (undefined4)uVar6;
      local_1d8 = 0x800000008;
      cv::Mat::Mat(&roi,input,(Rect_ *)&maxValue);
      dVar8 = multiplyAdd(&roi,&T);
      *(double *)(*local_168 * uVar6 + local_1a0 + uVar7 * 8) = dVar8;
      cv::Mat::~Mat(&roi);
    }
  }
  maxLoc.x = 0;
  maxLoc.y = 0;
  minLoc.x = 0;
  minLoc.y = 0;
  _roi = 0x1010000;
  p_Var1 = (_InputArray *)cv::noArray();
  cv::minMaxLoc((_InputArray *)&roi,&minValue,&maxValue,(Point_ *)&minLoc,(Point_ *)&maxLoc,p_Var1);
  dVar8 = (double)CONCAT44(maxValue._4_4_,maxValue._0_4_);
  cv::Mat::~Mat(&res_pce);
  cv::Mat::~Mat(&T);
  cv::Mat::~Mat(&T_);
  return dVar8;
}

Assistant:

double pce(const Mat &input)
{
    //设置8*8的模板
    Mat T_ = Mat(8, 8, CV_64FC1);
    T_.at<double>(0,0) = 1.0;
    Mat T=Mat(8, 8, T_.type());
    zero_mean(T_,T);
//    cout<<T<<endl;
    
    int rows = input.rows;
    int cols = input.cols;
    Mat res_pce = Mat(Size(rows-8,cols-8),CV_64FC1);
    
    for(int j = 0;j<cols-8;j++)
    {
        for(int i = 0;i<rows-8;i++)
        {
            Rect r= Rect(j,i,8,8);
            Mat roi = input(r);
            res_pce.at<double>(i,j)=multiplyAdd(roi,T);
        }
    }
    //找到所有PCE值里面最大的
    double maxValue,minValue;
    Point maxLoc,minLoc;
    minMaxLoc(res_pce,&minValue,&maxValue, &minLoc, &maxLoc);
    return maxValue;
}